

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

bool __thiscall Highs::qFormatOk(Highs *this,HighsInt num_nz,HighsInt format)

{
  if (format != 1 && num_nz != 0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Non-empty Hessian matrix has illegal format = %d\n",(ulong)(uint)format);
  }
  return format == 1 || num_nz == 0;
}

Assistant:

bool Highs::qFormatOk(const HighsInt num_nz, const HighsInt format) {
  if (!num_nz) return true;
  const bool ok_format = format == (HighsInt)HessianFormat::kTriangular;
  assert(ok_format);
  if (!ok_format)
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Non-empty Hessian matrix has illegal format = %" HIGHSINT_FORMAT "\n",
        format);
  return ok_format;
}